

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LegendreCorrFuncZ.cpp
# Opt level: O0

void __thiscall
OpenMD::LegendreCorrFuncZ::validateSelection(LegendreCorrFuncZ *this,SelectionManager *param_2)

{
  bool bVar1;
  StuntDouble *i_00;
  SelectionManager *in_RSI;
  int i;
  StuntDouble *sd;
  StuntDouble *in_stack_ffffffffffffffe0;
  int *in_stack_ffffffffffffffe8;
  
  for (i_00 = SelectionManager::beginSelected(in_RSI,in_stack_ffffffffffffffe8);
      i_00 != (StuntDouble *)0x0; i_00 = SelectionManager::nextSelected(in_RSI,(int *)i_00)) {
    bVar1 = StuntDouble::isDirectional(in_stack_ffffffffffffffe0);
    if (!bVar1) {
      snprintf(painCave.errMsg,2000,
               "LegendreCorrFuncZ::validateSelection Error: at least one of the selected objects is not Directional\n"
              );
      painCave.isFatal = 1;
      simError();
    }
  }
  return;
}

Assistant:

void LegendreCorrFuncZ::validateSelection(SelectionManager&) {
    StuntDouble* sd;
    int i;
    for (sd = seleMan1_.beginSelected(i); sd != NULL;
         sd = seleMan1_.nextSelected(i)) {
      if (!sd->isDirectional()) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "LegendreCorrFuncZ::validateSelection Error: "
                 "at least one of the selected objects is not Directional\n");
        painCave.isFatal = 1;
        simError();
      }
    }
  }